

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O0

bool __thiscall wasm::anon_unknown_0::TypeMerging::merge(TypeMerging *this,MergeKind kind)

{
  __node_base_ptr *this_00;
  __node_base_ptr *this_01;
  allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
  *this_02;
  pointer *ppvVar1;
  value_type this_03;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *a;
  bool bVar2;
  reference pHVar3;
  size_t sVar4;
  size_type sVar5;
  HeapType *pHVar6;
  pointer pvVar7;
  mapped_type *pmVar8;
  iterator iVar9;
  move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  __first;
  move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  __last;
  iterator __first_00;
  iterator __last_00;
  reference pvVar10;
  reference pHVar11;
  mapped_type *pmVar12;
  optional<wasm::HeapType> oVar13;
  HeapType local_370;
  HeapType type_1;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range3_2;
  value_type local_338;
  value_type target;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *partition;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  *__range2_1;
  undefined1 local_308 [7];
  bool merged;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> newMergeable;
  __normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  local_2d8;
  const_iterator local_2d0;
  undefined1 local_2c8 [8];
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  split;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *partitionTypes;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  *__range3_1;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  newPartitions;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  refinedPartitions;
  undefined1 local_238 [8];
  vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  dfa;
  State<wasm::HeapType> local_218;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_1f8;
  _List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
  local_1f0;
  iterator it_1;
  State<wasm::HeapType> local_1d0;
  uintptr_t local_1b0;
  _List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
  local_1a8;
  iterator it;
  _Storage<wasm::HeapType,_true> local_190;
  optional<wasm::HeapType> super;
  HeapType child;
  iterator __end3;
  iterator __begin3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_140;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_128;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range3;
  HeapType type;
  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  local_110;
  iterator __end2;
  iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_f0;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_d8;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  anon_class_24_3_c0978ed2 ensureShapePartition;
  anon_class_24_3_64d2c6ff ensurePartition;
  unordered_map<std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::equal_to<std::optional<wasm::HeapType>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>_>
  shapePartitions;
  unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
  typePartitions;
  Partitions partitions;
  MergeKind kind_local;
  TypeMerging *this_local;
  
  this_00 = &typePartitions._M_h._M_single_bucket;
  std::__cxx11::
  list<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ::list((list<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
          *)this_00);
  this_01 = &shapePartitions._M_h._M_single_bucket;
  std::
  unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
  ::unordered_map((unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
                   *)this_01);
  std::
  unordered_map<std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::equal_to<std::optional<wasm::HeapType>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>_>
  ::unordered_map((unordered_map<std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::equal_to<std::optional<wasm::HeapType>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>_>
                   *)&ensurePartition.this);
  __range2 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this;
  ensureShapePartition.this = (TypeMerging *)&ensurePartition.this;
  ensureShapePartition.shapePartitions =
       (unordered_map<std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::equal_to<std::optional<wasm::HeapType>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>_>
        *)this_00;
  ensureShapePartition.partitions = (Partitions *)this_01;
  ensurePartition.typePartitions =
       (unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
        *)this_00;
  ensurePartition.partitions = (Partitions *)this;
  mergeableSupertypesFirst(&local_f0,this,&this->mergeable);
  local_d8 = &local_f0;
  __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(local_d8);
  local_110._M_current =
       (HeapType *)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(local_d8);
  do {
    bVar2 = __gnu_cxx::operator!=(&__end2,&local_110);
    if (!bVar2) {
      type.id._4_4_ = 2;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_f0);
      iVar9 = std::__cxx11::
              list<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
              ::begin((list<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                       *)&typePartitions._M_h._M_single_bucket);
      __first = std::
                make_move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>
                          ((_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
                            )iVar9._M_node);
      iVar9 = std::__cxx11::
              list<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
              ::end((list<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                     *)&typePartitions._M_h._M_single_bucket);
      __last = std::
               make_move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>
                         ((_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
                           )iVar9._M_node);
      this_02 = (allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
                 *)((long)&refinedPartitions.
                           super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::
      allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
      ::allocator(this_02);
      std::
      vector<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>,std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>
      ::
      vector<std::move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>,void>
                ((vector<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>,std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>
                  *)local_238,__first,__last,this_02);
      std::
      allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
      ::~allocator((allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
                    *)((long)&refinedPartitions.
                              super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      DFA::refinePartitions<wasm::HeapType>
                ((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                  *)&newPartitions.
                     super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                  *)local_238);
      if (kind == Supertypes) {
        std::
        vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
        ::vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                  *)&__range3_1);
        ppvVar1 = &newPartitions.
                   super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end3_1 = std::
                   vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                   ::begin((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                            *)ppvVar1);
        partitionTypes =
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             std::
             vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             ::end((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                    *)ppvVar1);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                                   *)&partitionTypes), bVar2) {
          split.
          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               __gnu_cxx::
               __normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               ::operator*(&__end3_1);
          splitSupertypePartition
                    ((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      *)local_2c8,this,
                     split.
                     super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_2d8._M_current =
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               std::
               vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
               ::end((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      *)&__range3_1);
          __gnu_cxx::
          __normal_iterator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const*,std::vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>
          ::__normal_iterator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>*>
                    ((__normal_iterator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const*,std::vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>
                      *)&local_2d0,&local_2d8);
          __first_00 = std::
                       vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                       ::begin((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                *)local_2c8);
          __last_00 = std::
                      vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      ::end((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                             *)local_2c8);
          newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                        ::
                        insert<__gnu_cxx::__normal_iterator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>*,std::vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>,void>
                                  ((vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                                    *)&__range3_1,local_2d0,
                                   (__normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                                    )__first_00._M_current,
                                   (__normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                                    )__last_00._M_current);
          std::
          vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     *)local_2c8);
          __gnu_cxx::
          __normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
          ::operator++(&__end3_1);
        }
        std::
        vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
        ::operator=((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     *)&newPartitions.
                        super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     *)&__range3_1);
        std::
        vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
        ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                   *)&__range3_1);
      }
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_308);
      __range2_1._7_1_ = false;
      ppvVar1 = &newPartitions.
                 super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __end2_1 = std::
                 vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                 ::begin((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                          *)ppvVar1);
      partition = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                  std::
                  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                  ::end((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                         *)ppvVar1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                                 *)&partition), bVar2) {
        target.id = (uintptr_t)
                    __gnu_cxx::
                    __normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                    ::operator*(&__end2_1);
        mergeableSupertypesFirst
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range3_2,this,
                   (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)target.id);
        pvVar10 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::front
                            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range3_2)
        ;
        local_338.id = pvVar10->id;
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range3_2);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_308,&local_338);
        this_03 = target;
        __end3_2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                             ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)target.id);
        type_1.id = (uintptr_t)
                    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this_03.id);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3_2,
                                  (__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                   *)&type_1), bVar2) {
          pHVar11 = __gnu_cxx::
                    __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                    ::operator*(&__end3_2);
          local_370.id = pHVar11->id;
          bVar2 = HeapType::operator!=(&local_370,&local_338);
          if (bVar2) {
            pmVar12 = std::
                      unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                      ::operator[](&this->merges,&local_370);
            pmVar12->id = local_338.id;
            __range2_1._7_1_ = true;
          }
          __gnu_cxx::
          __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
          ::operator++(&__end3_2);
        }
        __gnu_cxx::
        __normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
        ::operator++(&__end2_1);
      }
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator=
                (&this->mergeable,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_308);
      type.id._4_4_ = 1;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_308);
      std::
      vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                 *)&newPartitions.
                    super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
      ::~vector((vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                 *)local_238);
      std::
      unordered_map<std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::equal_to<std::optional<wasm::HeapType>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>_>
      ::~unordered_map((unordered_map<std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::equal_to<std::optional<wasm::HeapType>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>_>
                        *)&ensurePartition.this);
      std::
      unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
      ::~unordered_map((unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
                        *)&shapePartitions._M_h._M_single_bucket);
      std::__cxx11::
      list<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
      ::~list((list<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
               *)&typePartitions._M_h._M_single_bucket);
      return __range2_1._7_1_;
    }
    pHVar3 = __gnu_cxx::
             __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2);
    __range3 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pHVar3->id;
    getPublicChildren(&local_140,this,(HeapType)__range3);
    local_128 = &local_140;
    __end3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(local_128);
    child.id = (uintptr_t)
               std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(local_128);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                       *)&child), bVar2) {
      pHVar3 = __gnu_cxx::
               __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end3);
      merge::anon_class_24_3_64d2c6ff::operator()
                ((anon_class_24_3_64d2c6ff *)&ensureShapePartition.partitions,(HeapType)pHVar3->id);
      __gnu_cxx::
      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end3);
    }
    type.id._4_4_ = 4;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_140);
    sVar4 = SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
            ::count(&(this->castTypes).
                     super_SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
                    ,(HeapType *)&__range3);
    if ((sVar4 == 0) &&
       (sVar5 = std::
                unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                ::count(&this->privateTypes,(key_type *)&__range3), sVar5 != 0)) {
      if (kind == Supertypes) {
        oVar13 = HeapType::getDeclaredSuperType((HeapType *)&__range3);
        local_190 = oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._M_payload;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
             oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_engaged;
        bVar2 = std::optional::operator_cast_to_bool((optional *)&local_190._M_value);
        a = __range3;
        if (bVar2) {
          pHVar6 = std::optional<wasm::HeapType>::operator*
                             ((optional<wasm::HeapType> *)&local_190._M_value);
          it._M_node = (_List_node_base *)pHVar6->id;
          bVar2 = shapeEq((HeapType)a,(HeapType)it._M_node);
          if (bVar2) {
            pHVar6 = std::optional<wasm::HeapType>::operator*
                               ((optional<wasm::HeapType> *)&local_190._M_value);
            local_1b0 = pHVar6->id;
            local_1a8._M_node =
                 (_List_node_base *)
                 merge::anon_class_24_3_64d2c6ff::operator()
                           ((anon_class_24_3_64d2c6ff *)&ensureShapePartition.partitions,
                            (HeapType)local_1b0);
            pvVar7 = std::
                     _List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
                     ::operator->(&local_1a8);
            makeDFAState(&local_1d0,this,(HeapType)__range3);
            std::
            vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
            ::push_back(pvVar7,&local_1d0);
            DFA::State<wasm::HeapType>::~State(&local_1d0);
            pmVar8 = std::
                     unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
                     ::operator[]((unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
                                   *)&shapePartitions._M_h._M_single_bucket,(key_type *)&__range3);
            pmVar8->_M_node = local_1a8._M_node;
            goto LAB_021ad0fd;
          }
        }
        it_1 = merge::anon_class_24_3_64d2c6ff::operator()
                         ((anon_class_24_3_64d2c6ff *)&ensureShapePartition.partitions,
                          (HeapType)__range3);
      }
      else if (kind == Siblings) {
        local_1f8 = __range3;
        local_1f0._M_node =
             (_List_node_base *)
             merge::anon_class_24_3_c0978ed2::operator()
                       ((anon_class_24_3_c0978ed2 *)&__range2,(HeapType)__range3);
        pvVar7 = std::
                 _List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
                 ::operator->(&local_1f0);
        dfa.
        super__Vector_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__range3;
        makeDFAState(&local_218,this,(HeapType)__range3);
        std::
        vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
        ::push_back(pvVar7,&local_218);
        DFA::State<wasm::HeapType>::~State(&local_218);
        pmVar8 = std::
                 unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
                               *)&shapePartitions._M_h._M_single_bucket,(key_type *)&__range3);
        pmVar8->_M_node = local_1f0._M_node;
      }
    }
    else {
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ =
           merge::anon_class_24_3_64d2c6ff::operator()
                     ((anon_class_24_3_64d2c6ff *)&ensureShapePartition.partitions,
                      (HeapType)__range3);
    }
LAB_021ad0fd:
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool TypeMerging::merge(MergeKind kind) {
  // Initial partitions are formed by grouping types with their structurally
  // similar supertypes or siblings, according to the `kind`.
  Partitions partitions;

#if TYPE_MERGING_DEBUG
  auto printedPrivateTypes = ModuleUtils::getPrivateHeapTypes(*module);
  using Fallback = IndexedTypeNameGenerator<DefaultTypeNameGenerator>;
  Fallback printPrivate(printedPrivateTypes, "private.");
  ModuleTypeNameGenerator<Fallback> print(*module, printPrivate);
  auto dumpPartitions = [&]() {
    size_t i = 0;
    for (auto& partition : partitions) {
      std::cerr << i++ << ": " << print(partition[0].val) << "\n";
      for (size_t j = 1; j < partition.size(); ++j) {
        std::cerr << "   " << print(partition[j].val) << "\n";
      }
      std::cerr << "\n";
    }
  };

#endif // TYPE_MERGING_DEBUG

  // Map each type to its partition in the list.
  std::unordered_map<HeapType, Partitions::iterator> typePartitions;

  // Map the supertypes and top-level structures of each type to partitions so
  // that siblings that refine the supertype in the same way can be assigned to
  // the same partition and potentially merged.
  std::unordered_map<
    std::optional<HeapType>,
    std::unordered_map<HeapType, Partitions::iterator, ShapeHash, ShapeEq>>
    shapePartitions;

  // Ensure the type has a partition and return a reference to it. Since we
  // merge up the type tree and visit supertypes first, the partition usually
  // already exists. The exception is when the supertype is public, in which
  // case we might not have created a partition for it yet.
  auto ensurePartition = [&](HeapType type) -> Partitions::iterator {
    auto [it, inserted] = typePartitions.insert({type, partitions.end()});
    if (inserted) {
      it->second = partitions.insert(partitions.end(), {makeDFAState(type)});
    }
    return it->second;
  };

  // Similar to the above, but look up or create a partition associated with the
  // type's supertype and top-level shape rather than its identity.
  auto ensureShapePartition = [&](HeapType type) -> Partitions::iterator {
    auto super = type.getDeclaredSuperType();
    if (super) {
      super = getMerged(*super);
    }
    auto [it, inserted] =
      shapePartitions[super].insert({type, partitions.end()});
    if (inserted) {
      it->second = partitions.insert(partitions.end(), Partition{});
    }
    return it->second;
  };

  // For each type, either create a new partition or add to its supertype's
  // partition.
  for (auto type : mergeableSupertypesFirst(mergeable)) {
    // We need partitions for any public children of this type since those
    // children will participate in the DFA we're creating.
    for (auto child : getPublicChildren(type)) {
      ensurePartition(child);
    }
    // If the type is distinguished by the module or public, we cannot merge it,
    // so create a new partition for it.
    if (castTypes.count(type) || !privateTypes.count(type)) {
      ensurePartition(type);
      continue;
    }

    switch (kind) {
      case Supertypes: {
        auto super = type.getDeclaredSuperType();
        if (super && shapeEq(type, *super)) {
          // The current type and its supertype have the same top-level
          // structure and are not distinguished, so add the current type to its
          // supertype's partition.
          auto it = ensurePartition(*super);
          it->push_back(makeDFAState(type));
          typePartitions[type] = it;
        } else {
          // Otherwise, create a new partition for this type.
          ensurePartition(type);
        }
        break;
      }
      case Siblings: {
        // Find or create a partition for this type's siblings of the same
        // shape.
        auto it = ensureShapePartition(type);
        it->push_back(makeDFAState(type));
        typePartitions[type] = it;
        break;
      }
    }
  }

#if TYPE_MERGING_DEBUG
  std::cerr << "Initial partitions (";
  switch (kind) {
    case Supertypes:
      std::cerr << "supertypes";
      break;
    case Siblings:
      std::cerr << "siblings";
      break;
  }
  std::cerr << "):\n";
  dumpPartitions();
#endif

  // Construct and refine the partitioned DFA.
  std::vector<Partition> dfa(std::make_move_iterator(partitions.begin()),
                             std::make_move_iterator(partitions.end()));
  auto refinedPartitions = DFA::refinePartitions(dfa);

#if TYPE_MERGING_DEBUG
  auto dumpRefinedPartitions = [&]() {
    size_t i = 0;
    for (auto& partition : refinedPartitions) {
      std::cerr << i++ << ": " << print(partition[0]) << "\n";
      for (size_t j = 1; j < partition.size(); ++j) {
        std::cerr << "   " << print(partition[j]) << "\n";
      }
      std::cerr << "\n";
    }
  };
  std::cerr << "Refined partitions:\n";
  dumpRefinedPartitions();
#endif

  if (kind == Supertypes) {
    // It's possible that a partition has been split such that a common ancestor
    // ended up in one of the new partitions, leaving unrelated types grouped
    // together in the other new partition. Since we are only supposed to be
    // merging types into their supertypes, merging such unrelated types would
    // be unsafe. Post-process the refined partitions to manually split any
    // partitions containing unrelated types.
    //
    // Normally splitting partitions like this would require re-running DFA
    // minimization afterward, but in this case it is not possible that the
    // manual splits cause types in any other partition to become
    // differentiatable. A type and its subtype cannot differ by referring to
    // different, unrelated types in the same position because then they would
    // not be in a valid subtype relationship.
    std::vector<std::vector<HeapType>> newPartitions;
    for (const auto& partitionTypes : refinedPartitions) {
      auto split = splitSupertypePartition(partitionTypes);
      newPartitions.insert(newPartitions.end(), split.begin(), split.end());
    }
    refinedPartitions = newPartitions;

#if TYPE_MERGING_DEBUG
    std::cerr << "Manually split partitions:\n";
    dumpRefinedPartitions();
#endif
  }

  // Merge each refined partition into a single type. We should only merge into
  // supertypes or siblings because if we try to merge into a subtype then we
  // will accidentally set that subtype to be its own supertype. Also keep track
  // of the remaining types.
  std::vector<HeapType> newMergeable;
  bool merged = false;
  for (const auto& partition : refinedPartitions) {
    auto target = mergeableSupertypesFirst(partition).front();
    newMergeable.push_back(target);
    for (auto type : partition) {
      if (type != target) {
        merges[type] = target;
        merged = true;
      }
    }
  }
  mergeable = std::move(newMergeable);

#if TYPE_MERGING_DEBUG
  std::cerr << "Merges:\n";
  std::unordered_map<HeapType, std::vector<HeapType>> mergees;
  for (auto& [mergee, target] : merges) {
    mergees[target].push_back(mergee);
  }
  for (auto& [target, types] : mergees) {
    std::cerr << "target: " << print(target) << "\n";
    for (auto type : types) {
      std::cerr << "  " << print(type) << "\n";
    }
    std::cerr << "\n";
  }
#endif // TYPE_MERGING_DEBUG

  return merged;
}